

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

int main(void)

{
  byte *pbVar1;
  double dVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint uVar13;
  bool bVar14;
  uint uVar15;
  long lVar16;
  long *plVar17;
  ostream *poVar18;
  ulong uVar19;
  ulong uVar20;
  runtime_error *prVar21;
  char cVar22;
  ulong uVar23;
  long *plVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  long *plVar28;
  byte bVar29;
  char *pcVar30;
  char *pcVar31;
  long lVar32;
  byte bVar33;
  uint __len;
  uint uVar34;
  uint uVar35;
  double dVar36;
  string s;
  double d;
  string __str;
  long *local_120;
  long local_110;
  long lStack_108;
  double local_100;
  double local_f8;
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  printf("FLT_EVAL_METHOD = %d\n",0);
  dVar36 = pow(10.0,-308.0);
  if ((dVar36 != 1e-308) || (NAN(dVar36))) {
    puts(
        "It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308)."
        );
    printf("Aborting further tests.");
  }
  else {
    issue2093();
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"1090544144181609348835077142190","");
    bVar14 = basic_test_64bit(&local_50,1.0905441441816094e+30);
    if (!bVar14) {
      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar21,"bug");
      __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"4503599627370496.5","");
    bVar14 = basic_test_64bit(&local_70,4503599627370496.0);
    if (!bVar14) {
      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar21,"bug");
      __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"4503599627370497.5","");
    bVar14 = basic_test_64bit(&local_90,4503599627370498.0);
    if (!bVar14) {
      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar21,"bug");
      __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375"
               ,"");
    bVar14 = basic_test_64bit(&local_b0,4.4501477170144023e-308);
    if (!bVar14) {
      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar21,"bug");
      __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375"
               ,"");
    bVar14 = basic_test_64bit(&local_d0,2.225073858507201e-308);
    if (!bVar14) {
      prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar21,"bug");
      __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    issue63();
    issue40();
    issue23();
    issue32();
    issue50_fastpath();
    issue50_off_fastpath();
    issue23_2();
    unit_tests();
    uVar34 = 0xfffffece;
    do {
      uVar35 = uVar34;
      if (uVar34 == 0x17) {
        uVar35 = 0x18;
      }
      putchar(0x2e);
      fflush((FILE *)0x0);
      lVar16 = (long)(int)uVar35;
      if (lVar16 + 0x16U < 0x2d) {
        if ((int)uVar35 < 0) {
          dVar36 = 1.0 / *(double *)
                          (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                           power_of_ten + lVar16 * -8);
        }
        else {
          dVar36 = *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + lVar16 * 8);
        }
      }
      else {
        uVar23 = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                            mantissa_64 + lVar16 * 8 + 0xa28);
        uVar20 = uVar23 << 0x3f;
        if ((uVar34 == 0xd2) || (uVar34 == 0x7e)) {
          if (uVar20 == 0) {
            uVar20 = 0;
            goto LAB_00106f25;
          }
          if ((((*(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                            mantissa_128 + lVar16 * 8 + 0xa28) & 1) != 0) &&
              (lVar16 == 0x7e || lVar16 == 0xd2)) &&
             ((*(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                          mantissa_128 + lVar16 * 8 + 0xa28) >> 1 | uVar20) == 0xffffffffffffffff))
          goto LAB_001076eb;
        }
        else {
LAB_00106f25:
          if ((((uint)uVar23 & 0xc00) == 0x400 && uVar20 == 0) && uVar35 < 0x18) goto LAB_001076eb;
        }
        uVar20 = (uVar23 >> 10) + (ulong)(((uint)uVar23 >> 10 & 1) != 0);
        uVar23 = ((lVar16 * 0x3526a >> 0x10) + 0x43f) - (0x40 - (ulong)(0x3fffffffffffff < uVar20));
        if ((uVar23 == 0) || (0x7fe < uVar23)) {
LAB_001076eb:
          puts("failed to parse");
          printf(" 10 ^ %d ",(ulong)uVar35);
          return 1;
        }
        uVar19 = 0;
        if (uVar20 < 0x40000000000000) {
          uVar19 = uVar20 >> 1 & 0x2fffffffffffff;
        }
        dVar36 = (double)(uVar23 << 0x34 | uVar19);
      }
      dVar2 = testing_power_of_ten[lVar16 + 0x133];
      if ((dVar36 != dVar2) || (NAN(dVar36) || NAN(dVar2))) {
        local_100 = dVar36;
        printf(" 10 ^ %d ",(ulong)uVar35);
        puts("bad parsing");
        printf("got: %.*e\n",local_100,0x10);
        printf("reference: %.*e\n",dVar2,0x10);
        return 1;
      }
      uVar34 = uVar35 + 1;
    } while ((int)uVar35 < 0x134);
    lVar16 = -0x132;
    do {
      uVar35 = (uint)lVar16;
      uVar34 = -uVar35;
      if (0 < (int)uVar35) {
        uVar34 = uVar35;
      }
      __len = 1;
      if (9 < uVar34) {
        uVar23 = (ulong)uVar34;
        uVar13 = 4;
        do {
          __len = uVar13;
          uVar15 = (uint)uVar23;
          if (uVar15 < 100) {
            __len = __len - 2;
            goto LAB_0010704b;
          }
          if (uVar15 < 1000) {
            __len = __len - 1;
            goto LAB_0010704b;
          }
          if (uVar15 < 10000) goto LAB_0010704b;
          uVar23 = uVar23 / 10000;
          uVar13 = __len + 4;
        } while (99999 < uVar15);
        __len = __len + 1;
      }
LAB_0010704b:
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct
                ((ulong)local_f0,(char)__len - ((char)((ulong)lVar16 >> 0x18) >> 7));
      std::__detail::__to_chars_10_impl<unsigned_int>(local_f0[0] + (uVar35 >> 0x1f),__len,uVar34);
      plVar17 = (long *)std::__cxx11::string::replace((ulong)local_f0,0,(char *)0x0,0x108d07);
      local_120 = &local_110;
      plVar24 = plVar17 + 2;
      if ((long *)*plVar17 == plVar24) {
        local_110 = *plVar24;
        lStack_108 = plVar17[3];
      }
      else {
        local_110 = *plVar24;
        local_120 = (long *)*plVar17;
      }
      lVar5 = plVar17[1];
      *plVar17 = (long)plVar24;
      plVar17[1] = 0;
      *(undefined1 *)(plVar17 + 2) = 0;
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0]);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"parsing ",8);
      poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(char *)local_120,lVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar18 + -0x18) + (char)poVar18);
      std::ostream::put((char)poVar18);
      std::ostream::flush();
      cVar3 = (char)*local_120;
      plVar17 = local_120;
      cVar22 = cVar3;
      if (cVar3 == '-') {
        cVar22 = *(char *)((long)local_120 + 1);
        if ((byte)(cVar22 - 0x30U) < 10) {
          plVar17 = (long *)((long)local_120 + 1);
          goto LAB_00107173;
        }
LAB_0010770c:
        printf("fast_double_parser refused to parse %s\n");
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar21,"fast_double_parser refused to parse");
LAB_001077e8:
        __cxa_throw(prVar21,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
LAB_00107173:
      if (cVar22 != '0') {
        if ((byte)(cVar22 - 0x30U) < 10) {
          uVar23 = (ulong)(byte)(cVar22 - 0x30U);
          bVar29 = *(byte *)((long)plVar17 + 1);
          plVar24 = plVar17;
          while( true ) {
            plVar28 = (long *)((long)plVar24 + 1);
            if (9 < (byte)(bVar29 - 0x30)) break;
            uVar23 = (ulong)(byte)(bVar29 - 0x30) + uVar23 * 10;
            bVar29 = *(byte *)((long)plVar24 + 2);
            plVar24 = plVar28;
          }
          goto LAB_001071ce;
        }
        goto LAB_0010770c;
      }
      bVar29 = *(byte *)((long)plVar17 + 1);
      if ((byte)(bVar29 - 0x30) < 10) goto LAB_0010770c;
      plVar28 = (long *)((long)plVar17 + 1);
      uVar23 = 0;
LAB_001071ce:
      if (bVar29 == 0x2e) {
        bVar29 = *(char *)((long)plVar28 + 1) - 0x30;
        if (9 < bVar29) goto LAB_0010770c;
        plVar24 = (long *)((long)plVar28 + 2);
        uVar23 = (ulong)bVar29 + uVar23 * 10;
        bVar29 = *(byte *)((long)plVar28 + 2);
        while ((byte)(bVar29 - 0x30) < 10) {
          uVar23 = (ulong)(byte)(bVar29 - 0x30) + uVar23 * 10;
          pbVar1 = (byte *)((long)plVar24 + 1);
          plVar24 = (long *)((long)plVar24 + 1);
          bVar29 = *pbVar1;
        }
        pcVar27 = (char *)((long)plVar28 + (1 - (long)plVar24));
        plVar28 = plVar24;
      }
      else {
        pcVar27 = (char *)0x0;
      }
      plVar24 = plVar28;
      if ((bVar29 | 0x20) == 0x65) {
        bVar14 = (*(char *)((long)plVar28 + 1) - 0x2bU & 0xfd) == 0;
        pcVar30 = (char *)((long)plVar28 + 1);
        if (bVar14) {
          pcVar30 = (char *)((long)plVar28 + 2);
        }
        bVar29 = *(char *)((long)plVar28 + (ulong)bVar14 + 1) - 0x30;
        if (9 < bVar29) goto LAB_0010770c;
        bVar33 = pcVar30[1] - 0x30;
        uVar20 = (ulong)bVar33 + (ulong)bVar29 * 10;
        if (9 < bVar33) {
          uVar20 = (ulong)bVar29;
        }
        pcVar31 = pcVar30 + 2;
        if (9 < bVar33) {
          pcVar31 = pcVar30 + 1;
        }
        bVar29 = pcVar30[(ulong)(bVar33 < 10) + 1] - 0x30;
        plVar24 = (long *)(pcVar31 + (bVar29 < 10));
        uVar19 = (ulong)bVar29 + uVar20 * 10;
        if (9 < bVar29) {
          uVar19 = uVar20;
        }
        cVar4 = (char)*plVar24;
        while ((byte)(cVar4 - 0x30U) < 10) {
          if ((long)uVar19 < 0x100000000) {
            uVar19 = (ulong)(byte)(cVar4 - 0x30U) + uVar19 * 10;
          }
          pcVar30 = (char *)((long)plVar24 + 1);
          plVar24 = (long *)((long)plVar24 + 1);
          cVar4 = *pcVar30;
        }
        uVar20 = -uVar19;
        if (*(char *)((long)plVar28 + 1) != '-') {
          uVar20 = uVar19;
        }
        pcVar27 = pcVar27 + uVar20;
      }
      if ((int)(~(uint)plVar17 + (int)plVar28) < 0x13) {
LAB_00107347:
        if (pcVar27 + -0x135 < (char *)0xfffffffffffffd86) goto LAB_00107356;
        if ((uVar23 >> 0x35 == 0) && (pcVar27 + 0x16 < (char *)0x2d)) {
          if ((long)pcVar27 < 0) {
            local_f8 = (double)(long)uVar23 /
                       *(double *)
                        (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                         power_of_ten + (long)pcVar27 * -8);
          }
          else {
            local_f8 = (double)(long)uVar23 *
                       *(double *)
                        (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                         power_of_ten + (long)pcVar27 * 8);
          }
          if (cVar3 == '-') {
            local_f8 = -local_f8;
          }
        }
        else {
          if (uVar23 != 0) {
            uVar20 = 0x3f;
            if (uVar23 != 0) {
              for (; uVar23 >> uVar20 == 0; uVar20 = uVar20 - 1) {
              }
            }
            uVar23 = uVar23 << ((byte)(uVar20 ^ 0x3f) & 0x3f);
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar23;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = *(ulong *)(fast_double_parser::
                                      compute_float_64(long,unsigned_long,bool,bool*)::mantissa_64 +
                                     (long)pcVar27 * 8 + 0xa28);
            auVar6 = auVar6 * auVar8;
            uVar19 = auVar6._0_8_;
            uVar25 = auVar6._8_8_ & 0x1ff;
            auVar8 = auVar6;
            if ((uVar25 == 0x1ff) && (uVar25 = 0x1ff, CARRY8(uVar19,uVar23))) {
              auVar7._8_8_ = 0;
              auVar7._0_8_ = uVar23;
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(fast_double_parser::
                                        compute_float_64(long,unsigned_long,bool,bool*)::
                                        mantissa_128 + (long)pcVar27 * 8 + 0xa28);
              uVar26 = SUB168(auVar7 * auVar9,8);
              auVar12._8_8_ = 0;
              auVar12._0_8_ = uVar26;
              auVar11._8_8_ = 0;
              auVar11._0_8_ = uVar26;
              auVar10._8_8_ = 0;
              auVar10._0_8_ = uVar26;
              uVar34 = auVar6._8_4_ + (uint)CARRY8(uVar19,uVar26) & 0x1ff;
              uVar25 = (ulong)uVar34;
              auVar8 = auVar6 + auVar12;
              if ((!CARRY8(SUB168(auVar7 * auVar9,0),uVar23)) ||
                 ((auVar8 = auVar6 + auVar11, uVar19 + uVar26 != -1 ||
                  (auVar8 = auVar6 + auVar10, uVar34 != 0x1ff)))) goto LAB_001073f5;
            }
            else {
LAB_001073f5:
              uVar23 = auVar8._8_8_ >> (9U - (auVar8[0xf] >> 7) & 0x3f);
              uVar34 = (uint)uVar23;
              if ((auVar8._0_8_ != 0) || ((uVar25 != 0 || ((uVar34 & 3) != 1)))) {
                uVar23 = (uVar34 & 1) + uVar23;
                uVar20 = (((long)pcVar27 * 0x3526a >> 0x10) + 0x43f) -
                         (((auVar8._8_8_ >> 0x3f ^ 1) + (uVar20 ^ 0x3f)) -
                         (ulong)(0x3fffffffffffff < uVar23));
                if ((uVar20 != 0) && (uVar20 < 0x7ff)) {
                  uVar19 = 0;
                  if (uVar23 < 0x40000000000000) {
                    uVar19 = uVar23 >> 1 & 0xefffffffffffff;
                  }
                  local_f8 = (double)((ulong)(cVar3 == '-') << 0x3f | uVar19 | uVar20 << 0x34);
                  goto LAB_001074f6;
                }
              }
            }
            local_f8 = 0.0;
            goto LAB_00107356;
          }
          local_f8 = -0.0;
          if (cVar3 != '-') {
            local_f8 = 0.0;
          }
        }
      }
      else {
        lVar32 = 1;
        while ((cVar22 == '0' || (cVar22 == '.'))) {
          pcVar30 = (char *)((long)plVar17 + lVar32);
          lVar32 = lVar32 + 1;
          cVar22 = *pcVar30;
        }
        if ((int)(((int)plVar28 - (uint)plVar17) - (int)lVar32) < 0x13) goto LAB_00107347;
LAB_00107356:
        plVar24 = (long *)fast_double_parser::parse_float_strtod((char *)local_120,&local_f8);
        if (plVar24 == (long *)0x0) goto LAB_0010770c;
      }
LAB_001074f6:
      if (plVar24 != (long *)((long)local_120 + lVar5)) {
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar21,"does not point at the end");
        goto LAB_001077e8;
      }
      dVar36 = testing_power_of_ten[lVar16 + 0x133];
      if ((local_f8 != dVar36) || (NAN(local_f8) || NAN(dVar36))) {
        local_100 = local_f8;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"fast_double_parser disagrees",0x1c);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        printf("fast_double_parser: %.*e\n",local_100,0x10);
        printf("reference: %.*e\n",dVar36,0x10);
        printf("string: %s\n",local_120);
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar21,"fast_double_parser disagrees");
        goto LAB_001077e8;
      }
      if (local_120 != &local_110) {
        operator_delete(local_120);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x135);
    negative_subsubnormal_to_negative_zero();
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All ok",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    puts("Good!");
  }
  return 0;
}

Assistant:

int main() {
  const int evl_method = FLT_EVAL_METHOD;
  printf("FLT_EVAL_METHOD = %d\n", evl_method);
  bool is_pow_correct{1e-308 == std::pow(10,-308)};
  if(!is_pow_correct) {
    printf("It appears that your system has bad floating-point support since 1e-308 differs from std::pow(10,-308).\n");
    printf("Aborting further tests.");
    return EXIT_SUCCESS;
  } 
  issue2093();
  Assert(basic_test_64bit("1090544144181609348835077142190",0x1.b8779f2474dfbp+99));
  Assert(basic_test_64bit("4503599627370496.5", 4503599627370496.5));
  Assert(basic_test_64bit("4503599627370497.5", 4503599627370497.5));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000044501477170144022721148195934182639518696390927032912960468522194496444440421538910330590478162701758282983178260792422137401728773891892910553144148156412434867599762821265346585071045737627442980259622449029037796981144446145705102663115100318287949527959668236039986479250965780342141637013812613333119898765515451440315261253813266652951306000184917766328660755595837392240989947807556594098101021612198814605258742579179000071675999344145086087205681577915435923018910334964869420614052182892431445797605163650903606514140377217442262561590244668525767372446430075513332450079650686719491377688478005309963967709758965844137894433796621993967316936280457084866613206797017728916080020698679408551343728867675409720757232455434770912461317493580281734466552734375));
  Assert(basic_test_64bit("0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375", 0.000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000022250738585072008890245868760858598876504231122409594654935248025624400092282356951787758888037591552642309780950434312085877387158357291821993020294379224223559819827501242041788969571311791082261043971979604000454897391938079198936081525613113376149842043271751033627391549782731594143828136275113838604094249464942286316695429105080201815926642134996606517803095075913058719846423906068637102005108723282784678843631944515866135041223479014792369585208321597621066375401613736583044193603714778355306682834535634005074073040135602968046375918583163124224521599262546494300836851861719422417646455137135420132217031370496583210154654068035397417906022589503023501937519773030945763173210852507299305089761582519159720757232455434770912461317493580281734466552734375));
  issue63();
  issue40();
  issue23();
  issue32();
  issue50_fastpath();
  issue50_off_fastpath();
  issue23_2();
  unit_tests();
  for (int p = -306; p <= 308; p++) {
    if (p == 23)
      p++;
    printf(".");
    fflush(NULL);
    bool success;
    double d = fast_double_parser::compute_float_64(p, 1, false, &success);
    if (!success) {
      printf("failed to parse\n");
      printf(" 10 ^ %d ", p);

      return EXIT_FAILURE;
    }
    if (d != testing_power_of_ten[p + 307]) {
      printf(" 10 ^ %d ", p);

      printf("bad parsing\n");
      printf("got: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);

      return EXIT_FAILURE;
    }
  }
  for (int p = -306; p <= 308; p++) {
    double d;
    std::string s = "1e"+std::to_string(p);
    std::cout << "parsing " << s << std::endl;
    const char * isok = fast_double_parser::parse_number(s.c_str(), &d);
    if (!isok) {
      printf("fast_double_parser refused to parse %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser refused to parse");
    }
    if(isok != s.c_str() + s.size()) throw std::runtime_error("does not point at the end");
    if (d != testing_power_of_ten[p + 307]) {
      std::cerr << "fast_double_parser disagrees" << std::endl;
      printf("fast_double_parser: %.*e\n", DBL_DIG + 1, d);
      printf("reference: %.*e\n", DBL_DIG + 1, testing_power_of_ten[p + 307]);
      printf("string: %s\n", s.c_str());
      throw std::runtime_error("fast_double_parser disagrees");
    }
  }
  negative_subsubnormal_to_negative_zero();
  std::cout << std::endl;
  std::cout << "All ok" << std::endl;
  printf("Good!\n");
  return EXIT_SUCCESS;
}